

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_intersect(REF_DBL *m1,REF_DBL *m2,REF_DBL *m12)

{
  REF_DBL local_178;
  REF_DBL local_170;
  double local_168;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_STATUS sqrt_m1_status;
  REF_DBL m12bar_system [12];
  REF_DBL m12bar [6];
  REF_DBL m2bar [6];
  REF_DBL m1neghalf [6];
  REF_DBL m1half [6];
  REF_DBL *m12_local;
  REF_DBL *m2_local;
  REF_DBL *m1_local;
  
  m1_local._4_4_ = ref_matrix_sqrt_m(m1,m1neghalf + 5,m2bar + 5);
  if (m1_local._4_4_ == 4) {
    for (ref_private_macro_code_rsb = 0; ref_private_macro_code_rsb < 6;
        ref_private_macro_code_rsb = ref_private_macro_code_rsb + 1) {
      m12[ref_private_macro_code_rsb] = m2[ref_private_macro_code_rsb];
    }
    m1_local._4_4_ = 0;
  }
  else if (m1_local._4_4_ == 0) {
    m1_local._4_4_ = ref_matrix_mult_m0m1m0(m2bar + 5,m2,m12bar + 5);
    if (m1_local._4_4_ == 0) {
      m1_local._4_4_ = ref_matrix_diag_m(m12bar + 5,(REF_DBL *)&i);
      if (m1_local._4_4_ == 0) {
        if (1.0 <= _i) {
          local_168 = _i;
        }
        else {
          local_168 = 1.0;
        }
        _i = local_168;
        if (1.0 <= m12bar_system[0]) {
          local_170 = m12bar_system[0];
        }
        else {
          local_170 = 1.0;
        }
        m12bar_system[0] = local_170;
        if (1.0 <= m12bar_system[1]) {
          local_178 = m12bar_system[1];
        }
        else {
          local_178 = 1.0;
        }
        m12bar_system[1] = local_178;
        m1_local._4_4_ = ref_matrix_form_m((REF_DBL *)&i,m12bar_system + 0xb);
        if (m1_local._4_4_ == 0) {
          m1_local._4_4_ = ref_matrix_mult_m0m1m0(m1neghalf + 5,m12bar_system + 0xb,m12);
          if (m1_local._4_4_ == 0) {
            m1_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                   ,0x2cd,"ref_matrix_intersect",(ulong)m1_local._4_4_,"m12=m1half*m12bar*m1half");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
                 0x2cb,"ref_matrix_intersect",(ulong)m1_local._4_4_,"form m12bar");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
               0x2c6,"ref_matrix_intersect",(ulong)m1_local._4_4_,"diag m12bar");
        printf("m1\n");
        ref_matrix_show_m(m1);
        printf("m2\n");
        ref_matrix_show_m(m2);
        printf("m2bar\n");
        ref_matrix_show_m(m12bar + 5);
        printf("m1neghalf\n");
        ref_matrix_show_m(m2bar + 5);
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",700,
             "ref_matrix_intersect",(ulong)m1_local._4_4_,"m2bar=m1half*m2*m1half");
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x2b5,
           "ref_matrix_intersect","ref_matrix_sqrt_m failed");
    printf("m1\n");
    ref_matrix_show_m(m1);
    printf("m2\n");
    ref_matrix_show_m(m2);
  }
  return m1_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_intersect(REF_DBL *m1, REF_DBL *m2,
                                        REF_DBL *m12) {
  REF_DBL m1half[6];
  REF_DBL m1neghalf[6];
  REF_DBL m2bar[6];
  REF_DBL m12bar[6];
  REF_DBL m12bar_system[12];
  REF_STATUS sqrt_m1_status;
  sqrt_m1_status = ref_matrix_sqrt_m(m1, m1half, m1neghalf);
  if (REF_DIV_ZERO == sqrt_m1_status) {
    REF_INT i;
    for (i = 0; i < 6; i++) m12[i] = m2[i];
    return REF_SUCCESS;
  }
  if (REF_SUCCESS != sqrt_m1_status) {
    REF_WHERE("ref_matrix_sqrt_m failed");
    printf("m1\n");
    ref_matrix_show_m(m1);
    printf("m2\n");
    ref_matrix_show_m(m2);
    return sqrt_m1_status;
  }
  RSS(ref_matrix_mult_m0m1m0(m1neghalf, m2, m2bar), "m2bar=m1half*m2*m1half");
  RSB(ref_matrix_diag_m(m2bar, m12bar_system), "diag m12bar", {
    printf("m1\n");
    ref_matrix_show_m(m1);
    printf("m2\n");
    ref_matrix_show_m(m2);
    printf("m2bar\n");
    ref_matrix_show_m(m2bar);
    printf("m1neghalf\n");
    ref_matrix_show_m(m1neghalf);
  });
  ref_matrix_eig(m12bar_system, 0) = MAX(1.0, ref_matrix_eig(m12bar_system, 0));
  ref_matrix_eig(m12bar_system, 1) = MAX(1.0, ref_matrix_eig(m12bar_system, 1));
  ref_matrix_eig(m12bar_system, 2) = MAX(1.0, ref_matrix_eig(m12bar_system, 2));

  RSS(ref_matrix_form_m(m12bar_system, m12bar), "form m12bar");

  RSS(ref_matrix_mult_m0m1m0(m1half, m12bar, m12), "m12=m1half*m12bar*m1half");

  return REF_SUCCESS;
}